

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O3

MPP_RET mpp_av1_read_unit(AV1Context *ctx,Av1ObuUnit *unit)

{
  int iVar1;
  AV1RawSequenceHeader *pAVar2;
  byte bVar3;
  RK_S32 RVar4;
  RK_S32 RVar5;
  MPP_RET MVar6;
  uint uVar7;
  AV1RawOBUHeader *current;
  AV1RawOBUHeader AVar8;
  int iVar9;
  RK_U32 hdr_fmt;
  AV1RawOBUHeader *write_to;
  RK_S32 extraout_EDX;
  RK_S32 extraout_EDX_00;
  AV1RawTileData *td;
  AV1RawDecoderModelInfo *current_00;
  AV1RawOBUHeader AVar10;
  AV1RawOBUHeader AVar11;
  AV1RawSequenceHeader *pAVar12;
  BitReadCtx_t *bitctx;
  int iVar13;
  char *in_R8;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  AV1RawOBUHeader AVar17;
  RK_U8 *pRVar18;
  bool bVar19;
  RK_U64 obu_size;
  BitReadCtx_t gbc;
  ulong in_stack_ffffffffffffff48;
  undefined4 uVar20;
  AV1RawOBUHeader local_a8;
  ulong local_a0;
  RK_U8 *local_98;
  MPP_RET local_54;
  AV1RawSequenceHeader *local_40;
  AV1RawSequenceHeader *local_38;
  
  if (unit->content != (void *)0x0) {
    mpp_osal_free("mpp_av1_alloc_unit_content",unit->content);
  }
  unit->content = (void *)0x0;
  current = (AV1RawOBUHeader *)mpp_osal_calloc("mpp_av1_alloc_unit_content",0xb20);
  unit->content = current;
  if (current == (AV1RawOBUHeader *)0x0) {
    return MPP_ERR_NOMEM;
  }
  mpp_set_bitread_ctx((BitReadCtx_t *)&stack0xffffffffffffff68,unit->data,(RK_S32)unit->data_size);
  RVar4 = mpp_get_bits_count((BitReadCtx_t *)&stack0xffffffffffffff68);
  RVar5 = mpp_av1_read_obu_header(ctx,(BitReadCtx_t *)&stack0xffffffffffffff68,current);
  if (RVar5 < 0) goto LAB_001be8ec;
  if (unit->type != (uint)current->obu_type) {
    in_stack_ffffffffffffff48 = CONCAT44((int)(in_stack_ffffffffffffff48 >> 0x20),0xb19);
    in_R8 = "obu->header.obu_type == unit->type";
    _mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
               "obu->header.obu_type == unit->type","mpp_av1_read_unit",in_stack_ffffffffffffff48);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001c050f;
  }
  if (current->obu_has_size_field == '\0') {
    if (unit->data_size <= (ulong)current->obu_extension_flag) {
      _mpp_log_l(2,"av1d_cbs","Invalid OBU length: unit too short (%d).\n",(char *)0x0);
      goto LAB_001be8ec;
    }
    in_R8 = (char *)(unit->data_size + ~(ulong)current->obu_extension_flag);
    current[1] = (AV1RawOBUHeader)in_R8;
  }
  else {
    local_a8.obu_forbidden_bit = '\0';
    local_a8.obu_type = '\0';
    local_a8.obu_extension_flag = '\0';
    local_a8.obu_has_size_field = '\0';
    local_a8.obu_reserved_1bit = '\0';
    local_a8.temporal_id = '\0';
    local_a8.spatial_id = '\0';
    local_a8.extension_header_reserved_3bits = '\0';
    MVar6 = mpp_av1_read_leb128((BitReadCtx_t *)&stack0xffffffffffffff68,(RK_U64 *)&local_a8);
    if (MVar6 < MPP_OK) {
      return MVar6;
    }
    current[1] = local_a8;
  }
  uVar7 = mpp_get_bits_count((BitReadCtx_t *)&stack0xffffffffffffff68);
  uVar14 = (ulong)uVar7;
  if (ctx->fist_tile_group == 0) {
    ctx->frame_tag_size = ctx->frame_tag_size + ((int)((uVar7 - RVar4) + 7) >> 3);
  }
  bVar3 = current->obu_type;
  if (((1 < (byte)(bVar3 - 1) && current->obu_extension_flag != '\0') &&
      (ctx->operating_point_idc != 0)) &&
     (((1 << ((char)ctx->spatial_id + 8U & 0x1f) | 1 << ((byte)ctx->temporal_id & 0x1f)) &
      ~ctx->operating_point_idc) != 0)) {
    return MPP_ERR_PROTOL;
  }
  if (((byte)av1d_debug & 2) != 0) {
    in_R8._1_1_ = '\0';
    in_R8._2_1_ = '\0';
    in_R8._3_1_ = '\0';
    in_R8._4_1_ = '\0';
    in_R8._5_1_ = '\0';
    in_R8._6_1_ = '\0';
    in_R8._7_1_ = '\0';
    in_R8._0_1_ = bVar3;
    _mpp_log_l(4,"av1d_cbs","obu type %d size %d\n","mpp_av1_read_unit",in_R8,current[1]);
    bVar3 = current->obu_type;
  }
  uVar20 = (undefined4)(in_stack_ffffffffffffff48 >> 0x20);
  MVar6 = MPP_ERR_VALUE;
  switch(bVar3) {
  case 1:
    MVar6 = mpp_av1_read_unsigned
                      ((BitReadCtx_t *)&stack0xffffffffffffff68,3,"seq_profile",(RK_U32 *)&local_a8,
                       0,2);
    if (MVar6 < MPP_OK) {
      return MVar6;
    }
    pAVar12 = (AV1RawSequenceHeader *)(current + 2);
    pAVar12->seq_profile = local_a8.obu_forbidden_bit;
    RVar4 = mpp_av1_read_unsigned
                      ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"still_picture",
                       (RK_U32 *)&local_a8,0,1);
    if (-1 < RVar4) {
      current[2].obu_type = local_a8.obu_forbidden_bit;
      RVar4 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"reduced_still_picture_header",
                         (RK_U32 *)&local_a8,0,1);
      uVar20 = (undefined4)(in_stack_ffffffffffffff48 >> 0x20);
      if (-1 < RVar4) {
        current[2].obu_extension_flag = local_a8.obu_forbidden_bit;
        if (local_a8.obu_forbidden_bit == '\0') {
          RVar4 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"timing_info_present_flag",
                             (RK_U32 *)&local_a8,0,1);
          if (-1 < RVar4) {
            current[2].obu_has_size_field = local_a8.obu_forbidden_bit;
            local_38 = pAVar12;
            if (local_a8.obu_forbidden_bit == '\0') {
              current[2].obu_reserved_1bit = '\0';
            }
            else {
              MVar6 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)&stack0xffffffffffffff68,0x20,
                                 "num_units_in_display_tick",(RK_U32 *)&local_a8,1,0xffffffff);
              AVar8 = local_a8;
              if (MVar6 < MPP_OK) {
                return MVar6;
              }
              current[3].obu_forbidden_bit = local_a8.obu_forbidden_bit;
              current[3].obu_type = local_a8.obu_type;
              current[3].obu_extension_flag = local_a8.obu_extension_flag;
              current[3].obu_has_size_field = local_a8.obu_has_size_field;
              local_a8 = AVar8;
              RVar4 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)&stack0xffffffffffffff68,0x20,"time_scale",
                                 (RK_U32 *)&local_a8,1,0xffffffff);
              AVar8 = local_a8;
              if (RVar4 < 0) {
                return MPP_NOK;
              }
              current[3].obu_reserved_1bit = local_a8.obu_forbidden_bit;
              current[3].temporal_id = local_a8.obu_type;
              current[3].spatial_id = local_a8.obu_extension_flag;
              current[3].extension_header_reserved_3bits = local_a8.obu_has_size_field;
              local_a8 = AVar8;
              RVar4 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"equal_picture_interval"
                                 ,(RK_U32 *)&local_a8,0,1);
              if (RVar4 < 0) {
                return MPP_NOK;
              }
              current[4].obu_forbidden_bit = local_a8.obu_forbidden_bit;
              bVar19 = local_a8.obu_forbidden_bit != '\0';
              if (bVar19) {
                mpp_read_ue((BitReadCtx_t *)&stack0xffffffffffffff68,(RK_U32 *)&local_a8);
                AVar8 = local_a8;
                if (local_a8._0_4_ == -1) {
                  _mpp_log_l(2,"av1d_cbs","%s out of range: %d, but must be in [%d,%d].\n",
                             "mpp_av1_read_uvlc","num_ticks_per_picture_minus_1",0xffffffff,
                             in_stack_ffffffffffffff48 & 0xffffffff00000000,0xfffffffe);
                  return MPP_NOK;
                }
                current[4].obu_reserved_1bit = local_a8.obu_forbidden_bit;
                current[4].temporal_id = local_a8.obu_type;
                current[4].spatial_id = local_a8.obu_extension_flag;
                current[4].extension_header_reserved_3bits = local_a8.obu_has_size_field;
                local_a8 = AVar8;
              }
              RVar4 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                 "decoder_model_info_present_flag",(RK_U32 *)&local_a8,0,1);
              if (RVar4 < 0) {
                return MPP_NOK;
              }
              current[2].obu_reserved_1bit = local_a8.obu_forbidden_bit;
              if ((local_a8.obu_forbidden_bit != '\0') &&
                 (MVar6 = mpp_av1_decoder_model_info
                                    ((AV1Context *)&stack0xffffffffffffff68,
                                     (BitReadCtx_t *)(current + 5),current_00), MVar6 < MPP_OK)) {
                return MVar6;
              }
            }
            RVar4 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                               "initial_display_delay_present_flag",(RK_U32 *)&local_a8,0,1);
            if (-1 < RVar4) {
              current[2].temporal_id = local_a8.obu_forbidden_bit;
              RVar4 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)&stack0xffffffffffffff68,5,
                                 "operating_points_cnt_minus_1",(RK_U32 *)&local_a8,0,0x1f);
              if (-1 < RVar4) {
                current[2].spatial_id = local_a8.obu_forbidden_bit;
                local_40 = (AV1RawSequenceHeader *)0xffffffffffffffff;
                local_a0 = uVar14;
                do {
                  RVar4 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,0xc,
                                     "operating_point_idc[i]",(RK_U32 *)&local_a8,0,0xfff);
                  pAVar2 = local_40;
                  if (RVar4 < 0) goto LAB_001be8ec;
                  *(undefined2 *)(&current[6].spatial_id + (long)local_40 * 2) = local_a8._0_2_;
                  RVar4 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,5,"seq_level_idx[i]",
                                     (RK_U32 *)&local_a8,0,0x1f);
                  pAVar12 = local_38;
                  if (RVar4 < 0) goto LAB_001be8ec;
                  (&current[0xe].temporal_id)[(long)pAVar2] = local_a8.obu_forbidden_bit;
                  if (local_a8.obu_forbidden_bit < 8) {
                    (&current[0x12].temporal_id)[(long)pAVar2] = '\0';
                  }
                  else {
                    RVar4 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"seq_tier[i]",
                                       (RK_U32 *)&local_a8,0,1);
                    if (RVar4 < 0) goto LAB_001be8ec;
                    (&current[0x12].temporal_id)[(long)pAVar2] = local_a8.obu_forbidden_bit;
                  }
                  if (current[2].obu_reserved_1bit == '\0') {
                    (&current[0x16].temporal_id)[(long)pAVar2] = '\0';
                  }
                  else {
                    RVar4 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                       "decoder_model_present_for_this_op[i]",(RK_U32 *)&local_a8,0,
                                       1);
                    if (RVar4 < 0) goto LAB_001be8ec;
                    (&current[0x16].temporal_id)[(long)pAVar2] = local_a8.obu_forbidden_bit;
                    if (local_a8.obu_forbidden_bit != '\0') {
                      iVar9 = current[5].obu_forbidden_bit + 1;
                      uVar7 = ~(uint)(-1L << ((byte)iVar9 & 0x3f));
                      RVar4 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,iVar9,
                                         "decoder_buffer_delay[i]",(RK_U32 *)&local_a8,0,uVar7);
                      if (RVar4 < 0) goto LAB_001be8ec;
                      *(undefined4 *)(&current[0x1b].obu_forbidden_bit + (long)pAVar2 * 4) =
                           local_a8._0_4_;
                      RVar4 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,iVar9,
                                         "encoder_buffer_delay[i]",(RK_U32 *)&local_a8,0,uVar7);
                      if (RVar4 < 0) goto LAB_001be8ec;
                      *(undefined4 *)(&current[0x2b].obu_forbidden_bit + (long)pAVar2 * 4) =
                           local_a8._0_4_;
                      RVar4 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                         "low_delay_mode_flag[i]",(RK_U32 *)&local_a8,0,1);
                      if (RVar4 < 0) goto LAB_001be8ec;
                      (&current[0x3a].temporal_id)[(long)pAVar2] = local_a8.obu_forbidden_bit;
                      pAVar12 = local_38;
                      uVar14 = local_a0;
                    }
                  }
                  if (current[2].temporal_id != '\0') {
                    RVar4 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                       "initial_display_delay_present_for_this_op[i]",
                                       (RK_U32 *)&local_a8,0,1);
                    if (RVar4 < 0) goto LAB_001be8ec;
                    (&current[0x3e].temporal_id)[(long)pAVar2] = local_a8.obu_forbidden_bit;
                    if (local_a8.obu_forbidden_bit != '\0') {
                      RVar4 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,4,
                                         "initial_display_delay_minus_1[i]",(RK_U32 *)&local_a8,0,
                                         0xf);
                      if (RVar4 < 0) goto LAB_001be8ec;
                      (&current[0x42].temporal_id)[(long)pAVar2] = local_a8.obu_forbidden_bit;
                    }
                  }
                  uVar20 = (undefined4)(in_stack_ffffffffffffff48 >> 0x20);
                  local_40 = (AV1RawSequenceHeader *)&pAVar2->still_picture;
                } while (local_40 < (undefined1 *)(ulong)current[2].spatial_id);
                goto LAB_001beb11;
              }
            }
          }
        }
        else {
          current[6].obu_reserved_1bit = '\0';
          current[6].temporal_id = '\0';
          current[2].obu_has_size_field = '\0';
          current[2].obu_reserved_1bit = '\0';
          current[2].temporal_id = '\0';
          current[2].spatial_id = '\0';
          RVar4 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)&stack0xffffffffffffff68,5,"seq_level_idx[0]",
                             (RK_U32 *)&local_a8,0,0x1f);
          if (-1 < RVar4) {
            current[0xe].obu_reserved_1bit = local_a8.obu_forbidden_bit;
            current[0x12].obu_reserved_1bit = '\0';
            current[0x16].obu_reserved_1bit = '\0';
            current[0x3e].obu_reserved_1bit = '\0';
LAB_001beb11:
            RVar4 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)&stack0xffffffffffffff68,4,"frame_width_bits_minus_1"
                               ,(RK_U32 *)&local_a8,0,0xf);
            if (-1 < RVar4) {
              current[0x46].obu_reserved_1bit = local_a8.obu_forbidden_bit;
              RVar4 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)&stack0xffffffffffffff68,4,
                                 "frame_height_bits_minus_1",(RK_U32 *)&local_a8,0,0xf);
              if (-1 < RVar4) {
                current[0x46].temporal_id = local_a8.obu_forbidden_bit;
                iVar9 = current[0x46].obu_reserved_1bit + 1;
                RVar4 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)&stack0xffffffffffffff68,iVar9,
                                   "max_frame_width_minus_1",(RK_U32 *)&local_a8,0,
                                   ~(uint)(-1L << ((byte)iVar9 & 0x3f)));
                AVar8 = local_a8;
                if (-1 < RVar4) {
                  current[0x46].spatial_id = local_a8.obu_forbidden_bit;
                  current[0x46].extension_header_reserved_3bits = local_a8.obu_type;
                  iVar9 = current[0x46].temporal_id + 1;
                  local_a8 = AVar8;
                  RVar4 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,iVar9,
                                     "max_frame_height_minus_1",(RK_U32 *)&local_a8,0,
                                     ~(uint)(-1L << ((byte)iVar9 & 0x3f)));
                  AVar8 = local_a8;
                  if (-1 < RVar4) {
                    current[0x47].obu_forbidden_bit = local_a8.obu_forbidden_bit;
                    current[0x47].obu_type = local_a8.obu_type;
                    local_a8 = AVar8;
                    if (current[2].obu_extension_flag == '\0') {
                      RVar4 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                         "frame_id_numbers_present_flag",(RK_U32 *)&local_a8,0,1);
                      if (-1 < RVar4) {
                        current[0x47].obu_extension_flag = local_a8.obu_forbidden_bit;
                        if (local_a8.obu_forbidden_bit == '\0') goto LAB_001bec1d;
                        RVar4 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,4,
                                           "delta_frame_id_length_minus_2",(RK_U32 *)&local_a8,0,0xf
                                          );
                        if (-1 < RVar4) {
                          current[0x47].obu_has_size_field = local_a8.obu_forbidden_bit;
                          RVar4 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)&stack0xffffffffffffff68,3,
                                             "additional_frame_id_length_minus_1",
                                             (RK_U32 *)&local_a8,0,7);
                          if (-1 < RVar4) {
                            current[0x47].obu_reserved_1bit = local_a8.obu_forbidden_bit;
                            goto LAB_001bec1d;
                          }
                        }
                      }
                    }
                    else {
                      current[0x47].obu_extension_flag = '\0';
LAB_001bec1d:
                      RVar4 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                         "use_128x128_superblock",(RK_U32 *)&local_a8,0,1);
                      if (-1 < RVar4) {
                        current[0x47].temporal_id = local_a8.obu_forbidden_bit;
                        RVar4 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                           "enable_filter_intra",(RK_U32 *)&local_a8,0,1);
                        if (-1 < RVar4) {
                          current[0x47].spatial_id = local_a8.obu_forbidden_bit;
                          local_a0 = uVar14;
                          RVar4 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                             "enable_intra_edge_filter",(RK_U32 *)&local_a8,0,1);
                          if (-1 < RVar4) {
                            current[0x47].extension_header_reserved_3bits =
                                 local_a8.obu_forbidden_bit;
                            if (current[2].obu_extension_flag != '\0') {
                              current[0x48].obu_has_size_field = '\0';
                              current[0x48].obu_reserved_1bit = '\0';
                              current[0x48].temporal_id = '\0';
                              current[0x48].spatial_id = '\0';
                              current[0x48].obu_forbidden_bit = '\0';
                              current[0x48].obu_type = '\0';
                              current[0x48].obu_extension_flag = '\0';
                              current[0x48].obu_has_size_field = '\0';
                              current[0x49].obu_forbidden_bit = '\x02';
                              current[0x49].obu_extension_flag = '\x02';
                              goto LAB_001bece9;
                            }
                            RVar4 = mpp_av1_read_unsigned
                                              ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                               "enable_interintra_compound",(RK_U32 *)&local_a8,0,1)
                            ;
                            if (-1 < RVar4) {
                              current[0x48].obu_forbidden_bit = local_a8.obu_forbidden_bit;
                              RVar4 = mpp_av1_read_unsigned
                                                ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                                 "enable_masked_compound",(RK_U32 *)&local_a8,0,1);
                              if (-1 < RVar4) {
                                current[0x48].obu_type = local_a8.obu_forbidden_bit;
                                RVar4 = mpp_av1_read_unsigned
                                                  ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                                   "enable_warped_motion",(RK_U32 *)&local_a8,0,1);
                                if (-1 < RVar4) {
                                  current[0x48].obu_extension_flag = local_a8.obu_forbidden_bit;
                                  RVar4 = mpp_av1_read_unsigned
                                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                                     "enable_dual_filter",(RK_U32 *)&local_a8,0,1);
                                  if (-1 < RVar4) {
                                    current[0x48].obu_has_size_field = local_a8.obu_forbidden_bit;
                                    RVar4 = mpp_av1_read_unsigned
                                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                                       "enable_order_hint",(RK_U32 *)&local_a8,0,1);
                                    if (-1 < RVar4) {
                                      current[0x48].obu_reserved_1bit = local_a8.obu_forbidden_bit;
                                      if (local_a8.obu_forbidden_bit == '\0') {
                                        current[0x48].temporal_id = '\0';
                                        current[0x48].spatial_id = '\0';
LAB_001c03cf:
                                        RVar4 = mpp_av1_read_unsigned
                                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,
                                                           1,"seq_choose_screen_content_tools",
                                                           (RK_U32 *)&local_a8,0,1);
                                        if (-1 < RVar4) {
                                          current[0x48].extension_header_reserved_3bits =
                                               local_a8.obu_forbidden_bit;
                                          if (local_a8.obu_forbidden_bit == '\0') {
                                            RVar4 = mpp_av1_read_unsigned
                                                              ((BitReadCtx_t *)
                                                               &stack0xffffffffffffff68,1,
                                                               "seq_force_screen_content_tools",
                                                               (RK_U32 *)&local_a8,0,1);
                                            if (-1 < RVar4) {
                                              current[0x49].obu_forbidden_bit =
                                                   local_a8.obu_forbidden_bit;
                                              if (local_a8.obu_forbidden_bit != '\0')
                                              goto LAB_001c0410;
LAB_001c04c0:
                                              current[0x49].obu_extension_flag = '\x02';
LAB_001c04c7:
                                              if (current[0x48].obu_reserved_1bit != '\0') {
                                                RVar4 = mpp_av1_read_unsigned
                                                                  ((BitReadCtx_t *)
                                                                   &stack0xffffffffffffff68,3,
                                                                   "order_hint_bits_minus_1",
                                                                   (RK_U32 *)&local_a8,0,7);
                                                if (RVar4 < 0) break;
                                                current[0x49].obu_has_size_field =
                                                     local_a8.obu_forbidden_bit;
                                              }
LAB_001bece9:
                                              RVar4 = mpp_av1_read_unsigned
                                                                ((BitReadCtx_t *)
                                                                 &stack0xffffffffffffff68,1,
                                                                 "enable_superres",
                                                                 (RK_U32 *)&local_a8,0,1);
                                              if (-1 < RVar4) {
                                                current[0x49].obu_reserved_1bit =
                                                     local_a8.obu_forbidden_bit;
                                                RVar4 = mpp_av1_read_unsigned
                                                                  ((BitReadCtx_t *)
                                                                   &stack0xffffffffffffff68,1,
                                                                   "enable_cdef",(RK_U32 *)&local_a8
                                                                   ,0,1);
                                                if (-1 < RVar4) {
                                                  current[0x49].temporal_id =
                                                       local_a8.obu_forbidden_bit;
                                                  RVar4 = mpp_av1_read_unsigned
                                                                    ((BitReadCtx_t *)
                                                                     &stack0xffffffffffffff68,1,
                                                                     "enable_restoration",
                                                                     (RK_U32 *)&local_a8,0,1);
                                                  if (-1 < RVar4) {
                                                    current[0x49].spatial_id =
                                                         local_a8.obu_forbidden_bit;
                                                    MVar6 = mpp_av1_color_config
                                                                      (ctx,(BitReadCtx_t *)
                                                                           &stack0xffffffffffffff68,
                                                                       (AV1RawColorConfig *)
                                                                       &current[0x49].
                                                                                                                                                
                                                  extension_header_reserved_3bits,
                                                  (uint)current[2].obu_forbidden_bit);
                                                  if (MVar6 < MPP_OK) {
                                                    return MVar6;
                                                  }
                                                  RVar4 = mpp_av1_read_unsigned
                                                                    ((BitReadCtx_t *)
                                                                     &stack0xffffffffffffff68,1,
                                                                     "film_grain_params_present",
                                                                     (RK_U32 *)&local_a8,0,1);
                                                  if (-1 < RVar4) {
                                                    current[0x4b].obu_has_size_field =
                                                         local_a8.obu_forbidden_bit;
                                                    ctx->frame_tag_size =
                                                         ctx->frame_tag_size + *(int *)(current + 1)
                                                    ;
                                                    uVar7 = ctx->operating_point;
                                                    if (-1 < (long)(int)uVar7) {
                                                      if (current[2].spatial_id < uVar7) {
                                                        _mpp_log_l(2,"av1d_cbs",
                                                                                                                                      
                                                  "Invalid Operating Point %d requested. Must not be higher than %u.\n"
                                                  ,(char *)0x0);
                                                  return MPP_ERR_PROTOL;
                                                  }
                                                  ctx->operating_point_idc =
                                                       (uint)*(ushort *)
                                                              (&current[6].obu_reserved_1bit +
                                                              (long)(int)uVar7 * 2);
                                                  }
                                                  ctx->sequence_header = pAVar12;
                                                  goto LAB_001beebc;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          else {
                                            current[0x49].obu_forbidden_bit = '\x02';
LAB_001c0410:
                                            RVar4 = mpp_av1_read_unsigned
                                                              ((BitReadCtx_t *)
                                                               &stack0xffffffffffffff68,1,
                                                               "seq_choose_integer_mv",
                                                               (RK_U32 *)&local_a8,0,1);
                                            if (-1 < RVar4) {
                                              current[0x49].obu_type = local_a8.obu_forbidden_bit;
                                              if (local_a8.obu_forbidden_bit != '\0')
                                              goto LAB_001c04c0;
                                              RVar4 = mpp_av1_read_unsigned
                                                                ((BitReadCtx_t *)
                                                                 &stack0xffffffffffffff68,1,
                                                                 "seq_force_integer_mv",
                                                                 (RK_U32 *)&local_a8,0,1);
                                              if (-1 < RVar4) {
                                                current[0x49].obu_extension_flag =
                                                     local_a8.obu_forbidden_bit;
                                                goto LAB_001c04c7;
                                              }
                                            }
                                          }
                                        }
                                      }
                                      else {
                                        RVar4 = mpp_av1_read_unsigned
                                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,
                                                           1,"enable_jnt_comp",(RK_U32 *)&local_a8,0
                                                           ,1);
                                        if (-1 < RVar4) {
                                          current[0x48].temporal_id = local_a8.obu_forbidden_bit;
                                          RVar4 = mpp_av1_read_unsigned
                                                            ((BitReadCtx_t *)
                                                             &stack0xffffffffffffff68,1,
                                                             "enable_ref_frame_mvs",
                                                             (RK_U32 *)&local_a8,0,1);
                                          if (-1 < RVar4) {
                                            current[0x48].spatial_id = local_a8.obu_forbidden_bit;
                                            goto LAB_001c03cf;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    break;
  case 2:
    ctx->seen_frame_header = 0;
    local_a0 = uVar14;
    goto LAB_001beebc;
  case 3:
  case 7:
    MVar6 = mpp_av1_frame_header_obu
                      (ctx,(BitReadCtx_t *)&stack0xffffffffffffff68,
                       (AV1RawFrameHeader *)(current + 2),(uint)(bVar3 == 7),in_R8);
    if (MVar6 < MPP_OK) {
      return MVar6;
    }
    ctx->frame_tag_size = ctx->frame_tag_size + *(int *)(current + 1);
    local_a0 = uVar14;
    goto LAB_001beebc;
  case 4:
    local_a0 = uVar14;
    RVar4 = mpp_get_bits_count((BitReadCtx_t *)&stack0xffffffffffffff68);
    MVar6 = mpp_av1_tile_group_obu
                      (ctx,(BitReadCtx_t *)&stack0xffffffffffffff68,(AV1RawTileGroup *)(current + 2)
                      );
    if (MVar6 < MPP_OK) {
      return MVar6;
    }
    if (ctx->fist_tile_group == 0) {
      RVar5 = mpp_get_bits_count((BitReadCtx_t *)&stack0xffffffffffffff68);
      ctx->frame_tag_size = ctx->frame_tag_size + ((RVar5 - RVar4) + 7U >> 3);
    }
    ctx->fist_tile_group = 1;
LAB_001bee8e:
    td = (AV1RawTileData *)(current + 3);
LAB_001bee9d:
    RVar4 = mpp_av1_ref_tile_data(unit,(BitReadCtx_t *)&stack0xffffffffffffff68,td);
    if (-1 < RVar4) goto LAB_001beebc;
    break;
  case 5:
    ctx->frame_tag_size = ctx->frame_tag_size + *(int *)(current + 1);
    MVar6 = mpp_av1_read_leb128((BitReadCtx_t *)&stack0xffffffffffffff68,(RK_U64 *)&local_a8);
    if (MVar6 < MPP_OK) {
      return MVar6;
    }
    current[2] = local_a8;
    AVar8 = local_a8;
    local_a0 = uVar14;
    if (((byte)av1d_debug & 8) != 0) {
      _mpp_log_l(4,"av1d_cbs","%s meta type %lld\n","mpp_av1_metadata_obu");
      AVar8 = current[2];
    }
    uVar20 = (undefined4)(in_stack_ffffffffffffff48 >> 0x20);
    switch(AVar8) {
    case (AV1RawOBUHeader)0x1:
      MVar6 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,"max_cll",(RK_U32 *)&local_a8
                         ,0,0xffff);
      AVar8 = local_a8;
      if (MVar6 < MPP_OK) {
        return MVar6;
      }
      current[3].obu_forbidden_bit = local_a8.obu_forbidden_bit;
      current[3].obu_type = local_a8.obu_type;
      local_a8 = AVar8;
      RVar4 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,"max_fall",
                         (RK_U32 *)&local_a8,0,0xffff);
      AVar8 = local_a8;
      if (-1 < RVar4) {
        current[3].obu_extension_flag = local_a8.obu_forbidden_bit;
        current[3].obu_has_size_field = local_a8.obu_type;
        (ctx->content_light).MaxCLL = *(RK_U16 *)(current + 3);
        (ctx->content_light).MaxFALL = local_a8._0_2_;
        local_a8 = AVar8;
        goto LAB_001beebc;
      }
      break;
    case (AV1RawOBUHeader)0x2:
      lVar16 = -6;
      do {
        RVar4 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,"primary_chromaticity_x[i]"
                           ,(RK_U32 *)&local_a8,0,0xffff);
        if (RVar4 < 0) goto LAB_001be8ec;
        *(undefined2 *)(&current[3].spatial_id + lVar16) = local_a8._0_2_;
        RVar4 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,"primary_chromaticity_y[i]"
                           ,(RK_U32 *)&local_a8,0,0xffff);
        uVar20 = (undefined4)(in_stack_ffffffffffffff48 >> 0x20);
        if (RVar4 < 0) goto LAB_001be8ec;
        *(undefined2 *)(&current[4].obu_reserved_1bit + lVar16) = local_a8._0_2_;
        lVar16 = lVar16 + 2;
      } while (lVar16 != 0);
      RVar4 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,"white_point_chromaticity_x",
                         (RK_U32 *)&local_a8,0,0xffff);
      AVar8 = local_a8;
      if (-1 < RVar4) {
        current[4].obu_reserved_1bit = local_a8.obu_forbidden_bit;
        current[4].temporal_id = local_a8.obu_type;
        local_a8 = AVar8;
        RVar4 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,
                           "white_point_chromaticity_y",(RK_U32 *)&local_a8,0,0xffff);
        AVar8 = local_a8;
        if (-1 < RVar4) {
          current[4].spatial_id = local_a8.obu_forbidden_bit;
          current[4].extension_header_reserved_3bits = local_a8.obu_type;
          local_a8 = AVar8;
          RVar4 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)&stack0xffffffffffffff68,0x20,"luminance_max",
                             (RK_U32 *)&local_a8,1,0xffffffff);
          AVar8 = local_a8;
          if (RVar4 < 0) {
            return MPP_NOK;
          }
          uVar14 = (ulong)local_a8 & 0xffffffff;
          current[5].obu_forbidden_bit = local_a8.obu_forbidden_bit;
          current[5].obu_type = local_a8.obu_type;
          current[5].obu_extension_flag = local_a8.obu_extension_flag;
          current[5].obu_has_size_field = local_a8.obu_has_size_field;
          uVar14 = uVar14 * 0x40 - 1;
          if (0xfffffffe < uVar14) {
            uVar14 = 0xffffffff;
          }
          local_a8 = AVar8;
          RVar4 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)&stack0xffffffffffffff68,0x20,"luminance_min",
                             (RK_U32 *)&local_a8,0,(RK_U32)uVar14);
          AVar8 = local_a8;
          if (RVar4 < 0) {
            return MPP_NOK;
          }
          current[5].obu_reserved_1bit = local_a8.obu_forbidden_bit;
          current[5].temporal_id = local_a8.obu_type;
          current[5].spatial_id = local_a8.obu_extension_flag;
          current[5].extension_header_reserved_3bits = local_a8.obu_has_size_field;
          lVar16 = 0;
          do {
            (ctx->mastering_display).display_primaries[lVar16][0] =
                 *(RK_U16 *)(&current[3].obu_forbidden_bit + lVar16 * 2);
            (ctx->mastering_display).display_primaries[lVar16][1] =
                 *(RK_U16 *)(&current[3].spatial_id + lVar16 * 2);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 3);
          (ctx->mastering_display).white_point[0] = *(RK_U16 *)&current[4].obu_reserved_1bit;
          (ctx->mastering_display).white_point[1] = *(RK_U16 *)&current[4].spatial_id;
          (ctx->mastering_display).max_luminance = *(RK_U32 *)(current + 5);
          (ctx->mastering_display).min_luminance = local_a8._0_4_;
          local_a8 = AVar8;
          goto LAB_001beebc;
        }
      }
      break;
    case (AV1RawOBUHeader)0x3:
      MVar6 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,8,"scalability_mode_idc",
                         (RK_U32 *)&local_a8,0,0xff);
      uVar20 = (undefined4)(in_stack_ffffffffffffff48 >> 0x20);
      if (MVar6 < MPP_OK) {
        return MVar6;
      }
      current[3].obu_forbidden_bit = local_a8.obu_forbidden_bit;
      bVar19 = local_a8.obu_forbidden_bit != '\x0e';
      if (bVar19) goto LAB_001beebc;
      pAVar12 = ctx->sequence_header;
      if (pAVar12 == (AV1RawSequenceHeader *)0x0) {
        _mpp_log_l(2,"av1d_cbs",
                   "No sequence header available: unable to parse scalability metadata.\n",
                   "mpp_av1_scalability_structure");
        return MPP_ERR_UNKNOW;
      }
      MVar6 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,2,"spatial_layers_cnt_minus_1",
                         (RK_U32 *)&local_a8,0,3);
      if (MVar6 < MPP_OK) {
        return MVar6;
      }
      current[3].obu_type = local_a8.obu_forbidden_bit;
      RVar4 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                         "spatial_layer_dimensions_present_flag",(RK_U32 *)&local_a8,0,1);
      if (-1 < RVar4) {
        current[3].obu_extension_flag = local_a8.obu_forbidden_bit;
        RVar4 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                           "spatial_layer_description_present_flag",(RK_U32 *)&local_a8,0,1);
        if (-1 < RVar4) {
          current[3].obu_has_size_field = local_a8.obu_forbidden_bit;
          RVar4 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                             "temporal_group_description_present_flag",(RK_U32 *)&local_a8,0,1);
          if (-1 < RVar4) {
            current[3].obu_reserved_1bit = local_a8.obu_forbidden_bit;
            RVar4 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)&stack0xffffffffffffff68,3,
                               "scalability_structure_reserved_3bits",(RK_U32 *)&local_a8,0,0);
            if (-1 < RVar4) {
              current[3].temporal_id = local_a8.obu_forbidden_bit;
              if (current[3].obu_extension_flag != '\0') {
                uVar14 = 0xffffffffffffffff;
                do {
                  RVar4 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,
                                     "spatial_layer_max_width[i]",(RK_U32 *)&local_a8,0,
                                     pAVar12->max_frame_width_minus_1 + 1);
                  if (RVar4 < 0) goto LAB_001be8ec;
                  (&current[3].extension_header_reserved_3bits)[uVar14] = local_a8.obu_forbidden_bit
                  ;
                  RVar4 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,
                                     "spatial_layer_max_height[i]",(RK_U32 *)&local_a8,0,
                                     pAVar12->max_frame_height_minus_1 + 1);
                  if (RVar4 < 0) goto LAB_001be8ec;
                  (&current[4].obu_has_size_field)[uVar14] = local_a8.obu_forbidden_bit;
                  uVar14 = uVar14 + 1;
                } while (uVar14 < current[3].obu_type);
              }
              if (current[3].obu_has_size_field != '\0') {
                uVar14 = 0xffffffffffffffff;
                do {
                  RVar4 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,8,
                                     "spatial_layer_ref_id[i]",(RK_U32 *)&local_a8,0,0xff);
                  if (RVar4 < 0) goto LAB_001be8ec;
                  (&current[4].extension_header_reserved_3bits)[uVar14] = local_a8.obu_forbidden_bit
                  ;
                  uVar14 = uVar14 + 1;
                } while (uVar14 < current[3].obu_type);
              }
              uVar20 = (undefined4)(in_stack_ffffffffffffff48 >> 0x20);
              if (current[3].obu_reserved_1bit != '\0') {
                RVar4 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)&stack0xffffffffffffff68,8,"temporal_group_size",
                                   (RK_U32 *)&local_a8,0,0xff);
                uVar20 = (undefined4)(in_stack_ffffffffffffff48 >> 0x20);
                if (RVar4 < 0) break;
                current[5].obu_extension_flag = local_a8.obu_forbidden_bit;
                if (local_a8.obu_forbidden_bit != '\0') {
                  pRVar18 = &current[0x84].extension_header_reserved_3bits;
                  uVar14 = 0;
                  do {
                    RVar4 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,3,
                                       "temporal_group_temporal_id[i]",(RK_U32 *)&local_a8,0,7);
                    if (RVar4 < 0) goto LAB_001be8ec;
                    (&current[5].obu_has_size_field)[uVar14] = local_a8.obu_forbidden_bit;
                    RVar4 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                       "temporal_group_temporal_switching_up_point_flag[i]",
                                       (RK_U32 *)&local_a8,0,1);
                    if (RVar4 < 0) goto LAB_001be8ec;
                    (&current[0x25].obu_extension_flag)[uVar14] = local_a8.obu_forbidden_bit;
                    RVar4 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                       "temporal_group_spatial_switching_up_point_flag[i]",
                                       (RK_U32 *)&local_a8,0,1);
                    if (RVar4 < 0) goto LAB_001be8ec;
                    (&current[0x45].obu_type)[uVar14] = local_a8.obu_forbidden_bit;
                    RVar4 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,3,
                                       "temporal_group_ref_cnt[i]",(RK_U32 *)&local_a8,0,7);
                    if (RVar4 < 0) goto LAB_001be8ec;
                    (&current[0x65].obu_forbidden_bit)[uVar14] = local_a8.obu_forbidden_bit;
                    if (local_a8.obu_forbidden_bit != '\0') {
                      uVar15 = 0;
                      do {
                        RVar4 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,8,
                                           "temporal_group_ref_pic_diff[i][j]",(RK_U32 *)&local_a8,0
                                           ,0xff);
                        if (RVar4 < 0) goto LAB_001be8ec;
                        pRVar18[uVar15] = local_a8.obu_forbidden_bit;
                        uVar15 = uVar15 + 1;
                      } while (uVar15 < (&current[0x65].obu_forbidden_bit)[uVar14]);
                    }
                    uVar20 = (undefined4)(in_stack_ffffffffffffff48 >> 0x20);
                    uVar14 = uVar14 + 1;
                    pRVar18 = pRVar18 + 7;
                  } while (uVar14 < current[5].obu_extension_flag);
                }
              }
              goto LAB_001beebc;
            }
          }
        }
      }
      break;
    case (AV1RawOBUHeader)0x4:
      MVar6 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,8,"itu_t_t35_country_code",
                         (RK_U32 *)&local_a8,0,0xff);
      if (MVar6 < MPP_OK) {
        return MVar6;
      }
      current[3].obu_forbidden_bit = local_a8.obu_forbidden_bit;
      if (local_a8.obu_forbidden_bit == 0xff) {
        RVar4 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,8,
                           "itu_t_t35_country_code_extension_byte",(RK_U32 *)&local_a8,0,0xff);
        if (RVar4 < 0) break;
        current[3].obu_type = local_a8.obu_forbidden_bit;
      }
      RVar4 = mpp_get_bits_left((BitReadCtx_t *)&stack0xffffffffffffff68);
      iVar9 = RVar4 + 7;
      if (-1 < RVar4) {
        iVar9 = RVar4;
      }
      AVar8 = (AV1RawOBUHeader)(long)((iVar9 >> 3) + -1);
      current[6] = AVar8;
      if (((byte)av1d_debug & 8) != 0) {
        _mpp_log_l(4,"av1d_cbs","%s itu_t_t35_country_code %d payload_size %d\n",
                   "mpp_av1_metadata_itut_t35","mpp_av1_metadata_itut_t35",
                   (ulong)current[3].obu_forbidden_bit,AVar8);
        uVar20 = AVar8._4_4_;
      }
      RVar4 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,
                         "itu_t_t35_terminal_provider_code",(RK_U32 *)&local_a8,0,0xffff);
      AVar8 = local_a8;
      if (-1 < RVar4) {
        current[3].obu_reserved_1bit = local_a8.obu_forbidden_bit;
        current[3].temporal_id = local_a8.obu_type;
        current[3].spatial_id = local_a8.obu_extension_flag;
        current[3].extension_header_reserved_3bits = local_a8.obu_has_size_field;
        iVar9 = local_a8._0_4_;
        local_a8 = AVar8;
        if (((byte)av1d_debug & 8) != 0) {
          _mpp_log_l(4,"av1d_cbs","itu_t_t35_country_code 0x%x\n","mpp_av1_metadata_itut_t35",
                     (ulong)current[3].obu_forbidden_bit);
          iVar9._0_1_ = current[3].obu_reserved_1bit;
          iVar9._1_1_ = current[3].temporal_id;
          iVar9._2_1_ = current[3].spatial_id;
          iVar9._3_1_ = current[3].extension_header_reserved_3bits;
          if (((byte)av1d_debug & 8) != 0) {
            _mpp_log_l(4,"av1d_cbs","itu_t_t35_terminal_provider_code 0x%x\n",
                       "mpp_av1_metadata_itut_t35");
            iVar9._0_1_ = current[3].obu_reserved_1bit;
            iVar9._1_1_ = current[3].temporal_id;
            iVar9._2_1_ = current[3].spatial_id;
            iVar9._3_1_ = current[3].extension_header_reserved_3bits;
          }
        }
        if (iVar9 == 0x3c) {
          write_to = &local_a8;
          RVar4 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,
                             "itu_t_t35_terminal_provider_oriented_code",(RK_U32 *)write_to,0,0xffff
                            );
          AVar8 = local_a8;
          hdr_fmt = (RK_U32)write_to;
          if (RVar4 < 0) break;
          current[4].obu_forbidden_bit = local_a8.obu_forbidden_bit;
          current[4].obu_type = local_a8.obu_type;
          current[4].obu_extension_flag = local_a8.obu_extension_flag;
          current[4].obu_has_size_field = local_a8.obu_has_size_field;
          local_a8 = AVar8;
          if (((byte)av1d_debug & 8) != 0) {
            hdr_fmt = 0x28ea98;
            _mpp_log_l(4,"av1d_cbs","itu_t_t35_terminal_provider_oriented_code 0x%x\n",
                       "mpp_av1_metadata_itut_t35");
          }
          local_54 = mpp_read_bits((BitReadCtx_t *)&stack0xffffffffffffff68,8,(RK_S32 *)&local_a8);
          if (((local_54 == MPP_OK) &&
              (iVar1._0_1_ = current[4].obu_forbidden_bit, iVar1._1_1_ = current[4].obu_type,
              iVar1._2_1_ = current[4].obu_extension_flag,
              iVar1._3_1_ = current[4].obu_has_size_field, iVar1 == 1)) &&
             (bVar19 = local_a8.obu_forbidden_bit == '\x04', bVar19)) {
            RVar4 = mpp_get_bits_left((BitReadCtx_t *)&stack0xffffffffffffff68);
            mpp_av1_fill_dynamic_meta(ctx,local_98,RVar4 >> 3,hdr_fmt);
          }
        }
        else if ((iVar9 == 0x3b) &&
                (local_54 = mpp_read_longbits((BitReadCtx_t *)&stack0xffffffffffffff68,0x20,
                                              (RK_U32 *)&local_a8), AVar8 = local_a8,
                local_54 == MPP_OK)) {
          current[4].obu_forbidden_bit = local_a8.obu_forbidden_bit;
          current[4].obu_type = local_a8.obu_type;
          current[4].obu_extension_flag = local_a8.obu_extension_flag;
          current[4].obu_has_size_field = local_a8.obu_has_size_field;
          iVar13 = local_a8._0_4_;
          local_a8 = AVar8;
          if (((byte)av1d_debug & 8) != 0) {
            _mpp_log_l(4,"av1d_cbs","itu_t_t35_terminal_provider_oriented_code 0x%x\n",
                       "mpp_av1_metadata_itut_t35");
            iVar13._0_1_ = current[4].obu_forbidden_bit;
            iVar13._1_1_ = current[4].obu_type;
            iVar13._2_1_ = current[4].obu_extension_flag;
            iVar13._3_1_ = current[4].obu_has_size_field;
          }
          if (iVar13 == 0x800) {
            mpp_av1_get_dolby_rpu(ctx,(BitReadCtx_t *)&stack0xffffffffffffff68);
          }
        }
        goto LAB_001beebc;
      }
      break;
    case (AV1RawOBUHeader)0x5:
      MVar6 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,5,"counting_type",
                         (RK_U32 *)&local_a8,0,0x1f);
      if (MVar6 < MPP_OK) {
        return MVar6;
      }
      current[3].obu_forbidden_bit = local_a8.obu_forbidden_bit;
      RVar4 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"full_timestamp_flag",
                         (RK_U32 *)&local_a8,0,1);
      if (-1 < RVar4) {
        current[3].obu_type = local_a8.obu_forbidden_bit;
        RVar4 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"discontinuity_flag",
                           (RK_U32 *)&local_a8,0,1);
        if (-1 < RVar4) {
          current[3].obu_extension_flag = local_a8.obu_forbidden_bit;
          RVar4 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"cnt_dropped_flag",
                             (RK_U32 *)&local_a8,0,1);
          if (-1 < RVar4) {
            current[3].obu_has_size_field = local_a8.obu_forbidden_bit;
            RVar4 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)&stack0xffffffffffffff68,9,"n_frames",
                               (RK_U32 *)&local_a8,0,0x1ff);
            if (-1 < RVar4) {
              current[3].obu_reserved_1bit = local_a8.obu_forbidden_bit;
              if (current[3].obu_type == '\0') {
                RVar4 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"seconds_flag",
                                   (RK_U32 *)&local_a8,0,1);
                if (-1 < RVar4) {
                  current[4].obu_forbidden_bit = local_a8.obu_forbidden_bit;
                  if (local_a8.obu_forbidden_bit == '\0') goto LAB_001c0167;
                  RVar4 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,6,"seconds_value",
                                     (RK_U32 *)&local_a8,0,0x3b);
                  if (-1 < RVar4) {
                    current[3].temporal_id = local_a8.obu_forbidden_bit;
                    RVar4 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"minutes_flag",
                                       (RK_U32 *)&local_a8,0,1);
                    if (-1 < RVar4) {
                      current[4].obu_type = local_a8.obu_forbidden_bit;
                      if (local_a8.obu_forbidden_bit == '\0') {
LAB_001c0167:
                        RVar4 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,5,
                                           "time_offset_length",(RK_U32 *)&local_a8,0,0x1f);
                        if (-1 < RVar4) {
                          bVar3 = local_a8.obu_forbidden_bit;
                          current[4].obu_has_size_field = bVar3;
                          if (bVar3 == 0) {
                            current[4].obu_has_size_field = '\0';
                          }
                          else {
                            RVar4 = mpp_av1_read_unsigned
                                              ((BitReadCtx_t *)&stack0xffffffffffffff68,
                                               local_a8._0_4_ & 0xff,"time_offset_value",
                                               (RK_U32 *)&local_a8,0,~(uint)(-1L << (bVar3 & 0x3f)))
                            ;
                            AVar8 = local_a8;
                            if (RVar4 < 0) break;
                            current[4].obu_reserved_1bit = local_a8.obu_forbidden_bit;
                            current[4].temporal_id = local_a8.obu_type;
                            current[4].spatial_id = local_a8.obu_extension_flag;
                            current[4].extension_header_reserved_3bits = local_a8.obu_has_size_field
                            ;
                            local_a8 = AVar8;
                          }
                          goto LAB_001beebc;
                        }
                      }
                      else {
                        RVar4 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,6,
                                           "minutes_value",(RK_U32 *)&local_a8,0,0x3b);
                        if (-1 < RVar4) {
                          current[3].spatial_id = local_a8.obu_forbidden_bit;
                          RVar4 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"hours_flag"
                                             ,(RK_U32 *)&local_a8,0,1);
                          if (-1 < RVar4) {
                            current[4].obu_extension_flag = local_a8.obu_forbidden_bit;
                            if (local_a8.obu_forbidden_bit != '\0') goto LAB_001bf2cf;
                            goto LAB_001c0167;
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                RVar4 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)&stack0xffffffffffffff68,6,"seconds_value",
                                   (RK_U32 *)&local_a8,0,0x3b);
                if (-1 < RVar4) {
                  current[3].temporal_id = local_a8.obu_forbidden_bit;
                  RVar4 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,6,"minutes_value",
                                     (RK_U32 *)&local_a8,0,0x3b);
                  if (-1 < RVar4) {
                    current[3].spatial_id = local_a8.obu_forbidden_bit;
LAB_001bf2cf:
                    RVar4 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,5,"hours_value",
                                       (RK_U32 *)&local_a8,0,0x17);
                    if (-1 < RVar4) {
                      current[3].extension_header_reserved_3bits = local_a8.obu_forbidden_bit;
                      goto LAB_001c0167;
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    default:
      _mpp_log_l(2,"av1d_cbs","unknown metadata type %lld\n","mpp_av1_metadata_obu",AVar8);
      goto LAB_001beebc;
    }
    break;
  case 6:
    bitctx = (BitReadCtx_t *)&stack0xffffffffffffff68;
    local_a0 = uVar14;
    RVar4 = mpp_get_bits_count(bitctx);
    MVar6 = mpp_av1_frame_header_obu(ctx,bitctx,(AV1RawFrameHeader *)(current + 2),0,in_R8);
    if (MVar6 < MPP_OK) {
      return MVar6;
    }
    mpp_av1_byte_alignment((AV1Context *)&stack0xffffffffffffff68,bitctx);
    RVar5 = mpp_av1_tile_group_obu
                      (ctx,(BitReadCtx_t *)&stack0xffffffffffffff68,
                       (AV1RawTileGroup *)(current + 0x85));
    if (-1 < RVar5) {
      RVar5 = mpp_get_bits_count((BitReadCtx_t *)&stack0xffffffffffffff68);
      ctx->frame_tag_size = ctx->frame_tag_size + ((RVar5 - RVar4) + 7U >> 3);
      td = (AV1RawTileData *)(current + 0x86);
      goto LAB_001bee9d;
    }
    break;
  case 8:
    MVar6 = mpp_av1_read_unsigned
                      ((BitReadCtx_t *)&stack0xffffffffffffff68,8,
                       "output_frame_width_in_tiles_minus_1",(RK_U32 *)&local_a8,0,0xff);
    if (MVar6 < MPP_OK) {
      return MVar6;
    }
    current[2].obu_forbidden_bit = local_a8.obu_forbidden_bit;
    RVar4 = mpp_av1_read_unsigned
                      ((BitReadCtx_t *)&stack0xffffffffffffff68,8,
                       "output_frame_height_in_tiles_minus_1",(RK_U32 *)&local_a8,0,0xff);
    if (-1 < RVar4) {
      current[2].obu_type = local_a8.obu_forbidden_bit;
      RVar4 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,"tile_count_minus_1",
                         (RK_U32 *)&local_a8,0,0xffff);
      if (-1 < RVar4) {
        current[2].obu_extension_flag = local_a8.obu_forbidden_bit;
        local_a0 = uVar14;
        goto LAB_001bee8e;
      }
    }
    break;
  default:
    goto switchD_001be896_caseD_9;
  case 0xf:
    local_a0 = uVar14;
    RVar4 = mpp_get_bits_left((BitReadCtx_t *)&stack0xffffffffffffff68);
    if (RVar4 < 8) {
      AVar8.obu_forbidden_bit = '\0';
      AVar8.obu_type = '\0';
      AVar8.obu_extension_flag = '\0';
      AVar8.obu_has_size_field = '\0';
      AVar8.obu_reserved_1bit = '\0';
      AVar8.temporal_id = '\0';
      AVar8.spatial_id = '\0';
      AVar8.extension_header_reserved_3bits = '\0';
    }
    else {
      AVar10.obu_forbidden_bit = '\0';
      AVar10.obu_type = '\0';
      AVar10.obu_extension_flag = '\0';
      AVar10.obu_has_size_field = '\0';
      AVar10.obu_reserved_1bit = '\0';
      AVar10.temporal_id = '\0';
      AVar10.spatial_id = '\0';
      AVar10.extension_header_reserved_3bits = '\0';
      AVar8.obu_forbidden_bit = '\0';
      AVar8.obu_type = '\0';
      AVar8.obu_extension_flag = '\0';
      AVar8.obu_has_size_field = '\0';
      AVar8.obu_reserved_1bit = '\0';
      AVar8.temporal_id = '\0';
      AVar8.spatial_id = '\0';
      AVar8.extension_header_reserved_3bits = '\0';
      do {
        local_54 = mpp_read_bits((BitReadCtx_t *)&stack0xffffffffffffff68,8,(RK_S32 *)&local_a8);
        if (local_54 != MPP_OK) {
          AVar8.obu_forbidden_bit = 0xff;
          AVar8.obu_type = 0xff;
          AVar8.obu_extension_flag = 0xff;
          AVar8.obu_has_size_field = 0xff;
          AVar8.obu_reserved_1bit = 0xff;
          AVar8.temporal_id = 0xff;
          AVar8.spatial_id = 0xff;
          AVar8.extension_header_reserved_3bits = 0xff;
          break;
        }
        if (local_a8.obu_forbidden_bit != '\0') {
          AVar8 = AVar10;
        }
        AVar10 = (AV1RawOBUHeader)((long)AVar10 + 1);
        RVar4 = mpp_get_bits_left((BitReadCtx_t *)&stack0xffffffffffffff68);
      } while (7 < RVar4);
    }
    current[3] = AVar8;
    AVar8 = (AV1RawOBUHeader)mpp_osal_malloc("mpp_av1_padding_obu",(size_t)AVar8);
    uVar20 = (undefined4)(in_stack_ffffffffffffff48 >> 0x20);
    current[2] = AVar8;
    if (AVar8 == (AV1RawOBUHeader)0x0) {
      return MPP_ERR_NOMEM;
    }
    if (current[3] != (AV1RawOBUHeader)0x0) {
      AVar11.obu_forbidden_bit = '\x01';
      AVar11.obu_type = '\0';
      AVar11.obu_extension_flag = '\0';
      AVar11.obu_has_size_field = '\0';
      AVar11.obu_reserved_1bit = '\0';
      AVar11.temporal_id = '\0';
      AVar11.spatial_id = '\0';
      AVar11.extension_header_reserved_3bits = '\0';
      AVar17.obu_forbidden_bit = '\0';
      AVar17.obu_type = '\0';
      AVar17.obu_extension_flag = '\0';
      AVar17.obu_has_size_field = '\0';
      AVar17.obu_reserved_1bit = '\0';
      AVar17.temporal_id = '\0';
      AVar17.spatial_id = '\0';
      AVar17.extension_header_reserved_3bits = '\0';
      do {
        AVar8 = AVar11;
        RVar4 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,8,"obu_padding_byte[i]",
                           (RK_U32 *)&local_a8,0,0xff);
        uVar20 = (undefined4)(in_stack_ffffffffffffff48 >> 0x20);
        if (RVar4 < 0) goto LAB_001be8ec;
        *(RK_U8 *)((long)current[2] + (long)AVar17) = local_a8.obu_forbidden_bit;
        AVar11._0_4_ = AVar8._0_4_ + 1;
        AVar11.obu_reserved_1bit = '\0';
        AVar11.temporal_id = '\0';
        AVar11.spatial_id = '\0';
        AVar11.extension_header_reserved_3bits = '\0';
        AVar17 = AVar8;
      } while ((ulong)AVar8 < (ulong)current[3]);
    }
LAB_001beebc:
    RVar5 = mpp_get_bits_count((BitReadCtx_t *)&stack0xffffffffffffff68);
    RVar4 = extraout_EDX;
    if (((int)unit->data_size * 8 < RVar5) &&
       (_mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "end_pos <= (RK_S32)(unit->data_size * 8)","mpp_av1_read_unit",
                   CONCAT44(uVar20,0xb95)), RVar4 = extraout_EDX_00, (mpp_debug._3_1_ & 0x10) != 0))
    {
LAB_001c050f:
      abort();
    }
    MVar6 = MPP_OK;
    if ((current[1] != (AV1RawOBUHeader)0x0) &&
       ((8 < current->obu_type || (RVar4 = 0x150, (0x150U >> (current->obu_type & 0x1f) & 1) == 0)))
       ) {
      uVar7 = ((int)local_a0 - RVar5) + SUB84(current[1],0) * 8;
      MVar6 = MPP_NOK;
      if (0 < (int)uVar7) {
        mpp_av1_trailing_bits
                  ((AV1Context *)&stack0xffffffffffffff68,(BitReadCtx_t *)(ulong)uVar7,RVar4);
        MVar6 = MPP_OK;
      }
    }
    goto switchD_001be896_caseD_9;
  }
LAB_001be8ec:
  MVar6 = MPP_NOK;
switchD_001be896_caseD_9:
  return MVar6;
}

Assistant:

MPP_RET mpp_av1_read_unit(AV1Context *ctx, Av1ObuUnit *unit)
{
    AV1RawOBU *obu;
    BitReadCtx_t gbc;
    RK_S32 err = 0, start_pos, end_pos, hdr_start_pos;

    err = mpp_av1_alloc_unit_content(unit);

    if (err < 0)
        return err;

    obu = unit->content;

    mpp_set_bitread_ctx(&gbc, unit->data, unit->data_size);

    hdr_start_pos = mpp_get_bits_count(&gbc);

    err = mpp_av1_read_obu_header(ctx, &gbc, &obu->header);
    if (err < 0)
        return err;
    mpp_assert(obu->header.obu_type == unit->type);

    if (obu->header.obu_has_size_field) {
        RK_U64 obu_size = 0;
        err = mpp_av1_read_leb128(&gbc, &obu_size);
        if (err < 0)
            return err;
        obu->obu_size = obu_size;
    } else {
        if (unit->data_size < (RK_U32)(1 + obu->header.obu_extension_flag)) {
            mpp_err( "Invalid OBU length: "
                     "unit too short (%d).\n", unit->data_size);
            return MPP_NOK;
        }
        obu->obu_size = unit->data_size - 1 - obu->header.obu_extension_flag;
    }

    start_pos = mpp_get_bits_count(&gbc);
    if (!ctx->fist_tile_group)
        ctx->frame_tag_size += ((start_pos - hdr_start_pos + 7) >> 3);
    if (obu->header.obu_extension_flag) {
        if (obu->header.obu_type != AV1_OBU_SEQUENCE_HEADER &&
            obu->header.obu_type != AV1_OBU_TEMPORAL_DELIMITER &&
            ctx->operating_point_idc) {
            RK_S32 in_temporal_layer =
                (ctx->operating_point_idc >>  ctx->temporal_id    ) & 1;
            RK_S32 in_spatial_layer  =
                (ctx->operating_point_idc >> (ctx->spatial_id + 8)) & 1;
            if (!in_temporal_layer || !in_spatial_layer) {
                return MPP_ERR_PROTOL; // drop_obu()
            }
        }
    }
    av1d_dbg(AV1D_DBG_HEADER, "obu type %d size %d\n",
             obu->header.obu_type, obu->obu_size);
    switch (obu->header.obu_type) {
    case AV1_OBU_SEQUENCE_HEADER: {
        err = mpp_av1_sequence_header_obu(ctx, &gbc,
                                          &obu->obu.sequence_header);
        if (err < 0)
            return err;
        ctx->frame_tag_size += obu->obu_size;
        if (ctx->operating_point >= 0) {
            AV1RawSequenceHeader *sequence_header = &obu->obu.sequence_header;

            if (ctx->operating_point > sequence_header->operating_points_cnt_minus_1) {
                mpp_err("Invalid Operating Point %d requested. "
                        "Must not be higher than %u.\n",
                        ctx->operating_point, sequence_header->operating_points_cnt_minus_1);
                return MPP_ERR_PROTOL;
            }
            ctx->operating_point_idc = sequence_header->operating_point_idc[ctx->operating_point];
        }

        ctx->sequence_header = NULL;
        ctx->sequence_header = &obu->obu.sequence_header;
    } break;
    case AV1_OBU_TEMPORAL_DELIMITER: {
        err = mpp_av1_temporal_delimiter_obu(ctx, &gbc);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_FRAME_HEADER:
    case AV1_OBU_REDUNDANT_FRAME_HEADER: {
        err = mpp_av1_frame_header_obu(ctx, &gbc,
                                       &obu->obu.frame_header,
                                       obu->header.obu_type ==
                                       AV1_OBU_REDUNDANT_FRAME_HEADER,
                                       NULL);
        if (err < 0)
            return err;
        ctx->frame_tag_size += obu->obu_size;
    } break;
    case AV1_OBU_TILE_GROUP: {
        RK_U32 cur_pos = mpp_get_bits_count(&gbc);

        err = mpp_av1_tile_group_obu(ctx, &gbc, &obu->obu.tile_group);
        if (err < 0)
            return err;
        if (!ctx->fist_tile_group)
            ctx->frame_tag_size += MPP_ALIGN(mpp_get_bits_count(&gbc) - cur_pos, 8) / 8;
        ctx->fist_tile_group = 1;
        err = mpp_av1_ref_tile_data(unit, &gbc,
                                    &obu->obu.tile_group.tile_data);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_FRAME: {
        err = mpp_av1_frame_obu(ctx, &gbc, &obu->obu.frame,
                                NULL);
        if (err < 0)
            return err;

        err = mpp_av1_ref_tile_data(unit, &gbc,
                                    &obu->obu.frame.tile_group.tile_data);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_TILE_LIST: {
        err = mpp_av1_tile_list_obu(ctx, &gbc, &obu->obu.tile_list);
        if (err < 0)
            return err;

        err = mpp_av1_ref_tile_data(unit, &gbc,
                                    &obu->obu.tile_list.tile_data);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_METADATA: {
        ctx->frame_tag_size += obu->obu_size;
        err = mpp_av1_metadata_obu(ctx, &gbc, &obu->obu.metadata);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_PADDING: {
        err = mpp_av1_padding_obu(ctx, &gbc, &obu->obu.padding);
        if (err < 0)
            return err;
    } break;
    default:
        return MPP_ERR_VALUE;
    }

    end_pos = mpp_get_bits_count(&gbc);
    mpp_assert(end_pos <= (RK_S32)(unit->data_size * 8));

    if (obu->obu_size > 0 &&
        obu->header.obu_type != AV1_OBU_TILE_GROUP &&
        obu->header.obu_type != AV1_OBU_TILE_LIST &&
        obu->header.obu_type != AV1_OBU_FRAME) {
        RK_S32 nb_bits = obu->obu_size * 8 + start_pos - end_pos;

        if (nb_bits <= 0)
            return MPP_NOK;

        err = mpp_av1_trailing_bits(ctx, &gbc, nb_bits);
        if (err < 0)
            return err;
    }

    return 0;
}